

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,AccessChainFlags flags,AccessChainMeta *meta)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  byte bVar4;
  TypeID type_id;
  StorageClass SVar5;
  int iVar6;
  SPIRExpression *pSVar7;
  SPIRType *pSVar8;
  long lVar9;
  undefined7 extraout_var;
  string *psVar10;
  undefined8 uVar11;
  undefined7 uVar15;
  SPIRVariable *var;
  mapped_type *pmVar12;
  SPIRConstant *pSVar13;
  CompilerError *pCVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  byte bVar16;
  uint uVar17;
  CompilerGLSL *pCVar18;
  ulong uVar19;
  undefined4 in_register_00000084;
  string *ts_2;
  undefined4 in_register_0000008c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3;
  uint32_t uVar20;
  bool is_packed;
  uint32_t local_120;
  bool access_chain_is_arrayed;
  SPIRType *type;
  uint32_t base_local;
  undefined4 local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint32_t local_f8;
  uint local_f4;
  string qual_mbr_name;
  BuiltIn builtin;
  uint local_cc;
  uint local_c8;
  AccessChainFlags flags_local;
  string local_c0;
  ulong local_a0;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_98;
  uint32_t *local_90;
  ulong local_88;
  anon_class_48_6_4d0f9c4a append_index;
  string local_50;
  
  ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(in_register_0000008c,flags);
  ts_2 = (string *)CONCAT44(in_register_00000084,count);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  base_local = base;
  local_108 = flags;
  flags_local = flags;
  local_90 = indices;
  if ((flags & 2) == 0) {
    pSVar7 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,base);
    if (pSVar7 == (SPIRExpression *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = pSVar7->need_transpose;
      pSVar7->need_transpose = false;
    }
    to_enclosed_expression_abi_cxx11_((string *)&append_index,this,base_local,(local_108 & 8) == 0);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&append_index);
    ::std::__cxx11::string::~string((string *)&append_index);
    if (pSVar7 != (SPIRExpression *)0x0) {
      pSVar7->need_transpose = bVar3;
    }
  }
  type_id.id = Compiler::expression_type_id(&this->super_Compiler,base_local);
  if ((this->backend).native_pointers == false) {
    if ((local_108 & 4) != 0) {
      pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&append_index,
                 "Backend does not support native pointers and does not support OpPtrAccessChain.",
                 (allocator *)&qual_mbr_name);
      CompilerError::CompilerError(pCVar14,(string *)&append_index);
      __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar3 = should_dereference(this,base_local);
    if (bVar3) {
      pSVar8 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type_id.id);
      dereference_expression((string *)&append_index,this,pSVar8,__return_storage_ptr__);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&append_index);
      ::std::__cxx11::string::~string((string *)&append_index);
    }
  }
  type = Compiler::get_pointee_type(&this->super_Compiler,type_id.id);
  lVar9 = ::std::__cxx11::string::find((char)__return_storage_ptr__,0x5b);
  access_chain_is_arrayed = lVar9 != -1;
  local_100 = (*(this->super_Compiler)._vptr_Compiler[0x25])(this,(ulong)base_local);
  is_packed = Compiler::has_extended_decoration
                        (&this->super_Compiler,base_local,SPIRVCrossDecorationPhysicalTypePacked);
  local_f8 = Compiler::get_extended_decoration
                       (&this->super_Compiler,base_local,SPIRVCrossDecorationPhysicalTypeID);
  bVar3 = Compiler::has_decoration(&this->super_Compiler,(ID)base_local,DecorationInvariant);
  local_f4 = (uint)CONCAT71(extraout_var,bVar3);
  append_index.flags = &flags_local;
  append_index.base = &base_local;
  append_index.type = &type;
  append_index.access_chain_is_arrayed = &access_chain_is_arrayed;
  local_c8 = local_108 & 0x11;
  local_98 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&(this->super_Compiler).ir.meta;
  uVar19 = 0;
  local_cc = local_108 & 0xff;
  local_104 = 0;
  local_fc = 0;
  local_88 = (ulong)count;
  append_index.this = this;
  append_index.expr = __return_storage_ptr__;
  do {
    if (uVar19 == local_88) {
      if ((local_104 & 1) == 0) {
        if (meta != (AccessChainMeta *)0x0) {
          meta->need_transpose = (bool)((byte)local_100 & 1);
          meta->storage_is_packed = is_packed;
          meta->storage_is_invariant = (bool)((byte)local_f4 & 1);
          meta->storage_physical_type = local_f8;
        }
        return __return_storage_ptr__;
      }
      pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&qual_mbr_name,
                 "Flattening of multidimensional arrays were enabled, but the access chain was terminated in the middle of a multidimensional array. This is not supported."
                 ,(allocator *)&local_c0);
      CompilerError::CompilerError(pCVar14,&qual_mbr_name);
      __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar1 = local_90[uVar19];
    uVar17 = 0;
    if (-1 < (int)uVar1) {
      uVar17 = local_cc;
    }
    uVar20 = uVar1 & 0x7fffffff;
    if (local_c8 != 0x11) {
      uVar17 = local_cc;
      uVar20 = uVar1;
    }
    bVar16 = (byte)uVar17;
    local_120 = uVar20;
    local_a0 = uVar19;
    if (uVar19 == 0 && (local_108 & 4) != 0) {
      bVar4 = (this->options).flatten_multidimensional_arrays;
      if ((bool)bVar4 == true) {
        if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
          local_104 = 0;
          local_fc = 0;
        }
        else {
          pSVar8 = type;
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          bVar4 = (this->options).flatten_multidimensional_arrays;
          uVar15 = (undefined7)((ulong)pSVar8 >> 8);
          local_104 = (uint)CONCAT71(uVar15,1);
          local_fc = (uint)CONCAT71(uVar15,1);
        }
      }
      if (((bVar4 & 1) == 0) || ((local_fc & 1) == 0)) {
        access_chain_internal::anon_class_48_6_4d0f9c4a::operator()
                  (&append_index,local_120,(bool)(bVar16 & 1));
      }
      else {
        if ((uVar17 & 1) == 0) {
          to_enclosed_expression_abi_cxx11_(&qual_mbr_name,this,local_120,(local_108 & 8) == 0);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          ::std::__cxx11::to_string(&qual_mbr_name,local_120);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        ::std::__cxx11::string::~string((string *)&qual_mbr_name);
        uVar20 = (uint32_t)(type->array).super_VectorView<unsigned_int>.buffer_size;
        while (uVar20 = uVar20 - 1, uVar20 != 0xffffffff) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          pCVar18 = this;
          to_array_size_abi_cxx11_(&local_c0,this,type,uVar20);
          enclose_expression(&qual_mbr_name,pCVar18,&local_c0);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&qual_mbr_name);
          ::std::__cxx11::string::~string((string *)&local_c0);
        }
        if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
          local_104 = 0;
        }
        else {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          if ((local_104 & 1) != 0) goto LAB_00214768;
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
LAB_00214768:
      if (*(int *)&(type->super_IVariant).field_0xc == 0x15) {
        type_id.id = (type->parent_type).id;
        type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type_id.id);
      }
LAB_00214f59:
      access_chain_is_arrayed = true;
    }
    else {
      sVar2 = (type->array).super_VectorView<unsigned_int>.buffer_size;
      if (sVar2 != 0) {
        if (((this->options).flatten_multidimensional_arrays == true) && ((local_104 & 1) == 0)) {
          if (sVar2 == 1) {
            local_104 = 0;
            local_fc = 0;
          }
          else {
            uVar11 = ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            uVar15 = (undefined7)((ulong)uVar11 >> 8);
            local_104 = (uint)CONCAT71(uVar15,1);
            local_fc = (uint)CONCAT71(uVar15,1);
          }
        }
        if ((type->parent_type).id == 0) {
          __assert_fail("type->parent_type",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                        ,0x1fcd,
                        "string spirv_cross::CompilerGLSL::access_chain_internal(uint32_t, const uint32_t *, uint32_t, AccessChainFlags, AccessChainMeta *)"
                       );
        }
        var = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,base_local);
        if ((((local_a0 != 0) || (var == (SPIRVariable *)0x0)) ||
            ((this->backend).force_gl_in_out_block == false)) ||
           ((bVar3 = Compiler::is_builtin_variable(&this->super_Compiler,var), !bVar3 ||
            (bVar3 = Compiler::has_decoration
                               (&this->super_Compiler,(ID)(type->super_IVariant).self.id,
                                DecorationBlock), bVar3)))) {
          if (((this->options).flatten_multidimensional_arrays == true) && ((local_fc & 1) != 0)) {
            pSVar8 = Compiler::get<spirv_cross::SPIRType>
                               (&this->super_Compiler,(type->parent_type).id);
            if ((uVar17 & 1) == 0) {
              to_enclosed_expression_abi_cxx11_(&qual_mbr_name,this,local_120,(local_108 & 8) == 0);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            }
            else {
              ::std::__cxx11::to_string(&qual_mbr_name,local_120);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            }
            ::std::__cxx11::string::~string((string *)&qual_mbr_name);
            uVar20 = (uint32_t)(pSVar8->array).super_VectorView<unsigned_int>.buffer_size;
            while (uVar20 = uVar20 - 1, uVar20 != 0xffffffff) {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              pCVar18 = this;
              to_array_size_abi_cxx11_(&local_c0,this,pSVar8,uVar20);
              enclose_expression(&qual_mbr_name,pCVar18,&local_c0);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
              ::std::__cxx11::string::~string((string *)&qual_mbr_name);
              ::std::__cxx11::string::~string((string *)&local_c0);
            }
            if ((pSVar8->array).super_VectorView<unsigned_int>.buffer_size == 0) {
              local_104 = 0;
            }
            else {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              if ((local_104 & 1) != 0) goto LAB_00214f3d;
            }
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          else {
            uVar20 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)base_local,DecorationBuiltIn);
            iVar6 = (*(this->super_Compiler)._vptr_Compiler[0x22])(this,(ulong)uVar20);
            if ((char)iVar6 == '\0') {
              access_chain_internal::anon_class_48_6_4d0f9c4a::operator()
                        (&append_index,local_120,(bool)(bVar16 & 1));
            }
          }
        }
        else {
          qual_mbr_name._M_dataplus._M_p._0_4_ = base_local;
          pmVar12 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_98,(key_type *)&qual_mbr_name);
          if ((pmVar12->decoration).builtin_type < 2) {
            if (var->storage == StorageClassOutput) {
              to_expression_abi_cxx11_(&local_c0,this,local_120,(local_108 & 8) == 0);
              ts_2 = __return_storage_ptr__;
              join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                        (&qual_mbr_name,(spirv_cross *)"gl_out[",(char (*) [8])&local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x30b28e,(char (*) [3])__return_storage_ptr__,ts_3);
            }
            else {
              if (var->storage != StorageClassInput) goto LAB_00214c30;
              to_expression_abi_cxx11_(&local_c0,this,local_120,(local_108 & 8) == 0);
              ts_2 = __return_storage_ptr__;
              join<char_const(&)[7],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                        (&qual_mbr_name,(spirv_cross *)"gl_in[",(char (*) [7])&local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x30b28e,(char (*) [3])__return_storage_ptr__,ts_3);
            }
            ::std::__cxx11::string::operator=
                      ((string *)__return_storage_ptr__,(string *)&qual_mbr_name);
            ::std::__cxx11::string::~string((string *)&qual_mbr_name);
            ::std::__cxx11::string::~string((string *)&local_c0);
          }
          else {
LAB_00214c30:
            access_chain_internal::anon_class_48_6_4d0f9c4a::operator()
                      (&append_index,local_120,(bool)(bVar16 & 1));
          }
        }
LAB_00214f3d:
        type_id.id = (type->parent_type).id;
        type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type_id.id);
        goto LAB_00214f59;
      }
      if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
        if ((uVar17 & 1) == 0) {
          uVar20 = Compiler::evaluate_constant_u32(&this->super_Compiler,uVar20);
        }
        local_120 = uVar20;
        if ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size <= (ulong)uVar20) {
          pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&qual_mbr_name,"Member index is out of bounds!",
                     (allocator *)&local_c0);
          CompilerError::CompilerError(pCVar14,&qual_mbr_name);
          __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar3 = Compiler::is_member_builtin(&this->super_Compiler,type,uVar20,&builtin);
        if (bVar3) {
          if (access_chain_is_arrayed == true) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            (*(this->super_Compiler)._vptr_Compiler[0x14])
                      (&qual_mbr_name,this,(ulong)builtin,(ulong)type->storage);
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          }
          else {
            (*(this->super_Compiler)._vptr_Compiler[0x14])
                      (&qual_mbr_name,this,(ulong)builtin,(ulong)type->storage);
            ::std::__cxx11::string::operator=
                      ((string *)__return_storage_ptr__,(string *)&qual_mbr_name);
          }
        }
        else {
          psVar10 = Compiler::get_member_qualified_name_abi_cxx11_
                              (&this->super_Compiler,type_id,local_120);
          ::std::__cxx11::string::string((string *)&qual_mbr_name,(string *)psVar10);
          if (qual_mbr_name._M_string_length == 0) {
            ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (ulong)(uint)local_108;
            if ((local_108 & 0x20) == 0) {
              ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (ulong)((local_108 & 4) >> 2);
              ts_2 = (string *)(ulong)local_120;
              (*(this->super_Compiler)._vptr_Compiler[0x2a])(&local_c0,this,(ulong)base_local,type);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
              psVar10 = &local_c0;
            }
            else {
              ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (ulong)local_120;
              to_member_name_abi_cxx11_(&local_50,this,type,local_120);
              join<char_const(&)[2],std::__cxx11::string>
                        (&local_c0,(spirv_cross *)0x30ed65,(char (*) [2])&local_50,ts_1);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
              ::std::__cxx11::string::~string((string *)&local_c0);
              psVar10 = &local_50;
            }
            ::std::__cxx11::string::~string((string *)psVar10);
          }
          else {
            ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
          }
        }
        ::std::__cxx11::string::~string((string *)&qual_mbr_name);
        bVar3 = Compiler::has_member_decoration
                          (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,local_120,
                           DecorationInvariant);
        local_f4 = local_f4 & 0xff;
        if (bVar3) {
          local_f4 = 1;
        }
        is_packed = member_is_packed_physical_type(this,type,local_120);
        bVar3 = member_is_remapped_physical_type(this,type,local_120);
        local_f8 = 0;
        if (bVar3) {
          local_f8 = Compiler::get_extended_member_decoration
                               (&this->super_Compiler,(type->super_IVariant).self.id,local_120,
                                SPIRVCrossDecorationPhysicalTypeID);
        }
        local_100 = (*(this->super_Compiler)._vptr_Compiler[0x26])(this,type,(ulong)local_120);
        type = Compiler::get<spirv_cross::SPIRType>
                         (&this->super_Compiler,
                          (type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                          [local_120].id);
      }
      else if (type->columns < 2) {
        if (type->vecsize < 2) {
          if ((this->backend).allow_truncated_access_chain == false) {
            pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&qual_mbr_name,"Cannot subdivide a scalar value!",
                       (allocator *)&local_c0);
            CompilerError::CompilerError(pCVar14,&qual_mbr_name);
            __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        else {
          qual_mbr_name._M_dataplus._M_p = (pointer)&qual_mbr_name.field_2;
          qual_mbr_name._M_string_length = 0;
          qual_mbr_name.field_2._M_local_buf[0] = '\0';
          if (((local_100 & 1) != 0) &&
             (lVar9 = ::std::__cxx11::string::rfind((char)__return_storage_ptr__,0x5b), lVar9 != -1)
             ) {
            ::std::__cxx11::string::substr((ulong)&local_c0,(ulong)__return_storage_ptr__);
            ::std::__cxx11::string::operator=((string *)&qual_mbr_name,(string *)&local_c0);
            ::std::__cxx11::string::~string((string *)&local_c0);
            ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
          }
          pSVar8 = Compiler::expression_type(&this->super_Compiler,base_local);
          SVar5 = StorageClassGeneric;
          if (pSVar8->pointer == true) {
            SVar5 = Compiler::get_expression_effective_storage_class
                              (&this->super_Compiler,base_local);
          }
          if ((local_100 & 1) == 0) {
            pSVar8 = Compiler::get<spirv_cross::SPIRType>
                               (&this->super_Compiler,(type->parent_type).id);
            ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (this->super_Compiler)._vptr_Compiler;
            ts_2 = (string *)&is_packed;
            (*(code *)ts_3[10]._M_string_length)(this,__return_storage_ptr__,pSVar8,SVar5);
          }
          if (((uVar17 & 1) == 0) || (((is_packed | (byte)local_100) & 1) != 0)) {
            if (((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[local_120]
                 .type != TypeConstant) || (((is_packed | (byte)local_100) & 1) != 0)) {
              if ((uVar17 & 1) != 0) {
                join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                          (&local_c0,(spirv_cross *)0x31c69e,(char (*) [2])&local_120,
                           (uint *)0x30e88f,(char (*) [2])ts_2);
                ::std::__cxx11::string::append((string *)__return_storage_ptr__);
                psVar10 = &local_c0;
                goto LAB_00214f9e;
              }
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              to_expression_abi_cxx11_(&local_c0,this,local_120,(local_108 & 8) == 0);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
              ::std::__cxx11::string::~string((string *)&local_c0);
              goto LAB_00214991;
            }
            pSVar13 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,local_120);
            if (pSVar13->specialization == true) {
              to_expression_abi_cxx11_(&local_50,this,local_120,true);
              join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                        (&local_c0,(spirv_cross *)0x31c69e,(char (*) [2])&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x30e88f,(char (*) [2])ts_2);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
              ::std::__cxx11::string::~string((string *)&local_c0);
              psVar10 = &local_50;
LAB_00214f9e:
              ::std::__cxx11::string::~string((string *)psVar10);
            }
            else {
              pCVar18 = (CompilerGLSL *)__return_storage_ptr__;
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              index_to_swizzle(pCVar18,(pSVar13->m).c[0].r[0].u32);
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
          }
          else {
            pCVar18 = (CompilerGLSL *)__return_storage_ptr__;
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            index_to_swizzle(pCVar18,local_120);
LAB_00214991:
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          if ((local_100 & 1) != 0) {
            pSVar8 = Compiler::get<spirv_cross::SPIRType>
                               (&this->super_Compiler,(type->parent_type).id);
            ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (this->super_Compiler)._vptr_Compiler;
            ts_2 = (string *)&is_packed;
            (*(code *)ts_3[10]._M_string_length)(this,__return_storage_ptr__,pSVar8,SVar5);
          }
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          is_packed = false;
          type_id.id = (type->parent_type).id;
          type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type_id.id);
          ::std::__cxx11::string::~string((string *)&qual_mbr_name);
          local_f8 = 0;
          local_100 = 0;
        }
      }
      else {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        if ((uVar17 & 1) == 0) {
          to_expression_abi_cxx11_(&qual_mbr_name,this,local_120,(local_108 & 8) == 0);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          ::std::__cxx11::to_string(&qual_mbr_name,local_120);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        ::std::__cxx11::string::~string((string *)&qual_mbr_name);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        type_id.id = (type->parent_type).id;
        type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type_id.id);
      }
    }
    uVar19 = local_a0 + 1;
  } while( true );
}

Assistant:

string CompilerGLSL::access_chain_internal(uint32_t base, const uint32_t *indices, uint32_t count,
                                           AccessChainFlags flags, AccessChainMeta *meta)
{
	string expr;

	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool msb_is_id = (flags & ACCESS_CHAIN_LITERAL_MSB_FORCE_ID) != 0;
	bool chain_only = (flags & ACCESS_CHAIN_CHAIN_ONLY_BIT) != 0;
	bool ptr_chain = (flags & ACCESS_CHAIN_PTR_CHAIN_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;
	bool flatten_member_reference = (flags & ACCESS_CHAIN_FLATTEN_ALL_MEMBERS_BIT) != 0;

	if (!chain_only)
	{
		// We handle transpose explicitly, so don't resolve that here.
		auto *e = maybe_get<SPIRExpression>(base);
		bool old_transpose = e && e->need_transpose;
		if (e)
			e->need_transpose = false;
		expr = to_enclosed_expression(base, register_expression_read);
		if (e)
			e->need_transpose = old_transpose;
	}

	// Start traversing type hierarchy at the proper non-pointer types,
	// but keep type_id referencing the original pointer for use below.
	uint32_t type_id = expression_type_id(base);

	if (!backend.native_pointers)
	{
		if (ptr_chain)
			SPIRV_CROSS_THROW("Backend does not support native pointers and does not support OpPtrAccessChain.");

		// Wrapped buffer reference pointer types will need to poke into the internal "value" member before
		// continuing the access chain.
		if (should_dereference(base))
		{
			auto &type = get<SPIRType>(type_id);
			expr = dereference_expression(type, expr);
		}
	}

	const auto *type = &get_pointee_type(type_id);

	bool access_chain_is_arrayed = expr.find_first_of('[') != string::npos;
	bool row_major_matrix_needs_conversion = is_non_native_row_major_matrix(base);
	bool is_packed = has_extended_decoration(base, SPIRVCrossDecorationPhysicalTypePacked);
	uint32_t physical_type = get_extended_decoration(base, SPIRVCrossDecorationPhysicalTypeID);
	bool is_invariant = has_decoration(base, DecorationInvariant);
	bool pending_array_enclose = false;
	bool dimension_flatten = false;

	const auto append_index = [&](uint32_t index, bool is_literal) {
		AccessChainFlags mod_flags = flags;
		if (!is_literal)
			mod_flags &= ~ACCESS_CHAIN_INDEX_IS_LITERAL_BIT;
		access_chain_internal_append_index(expr, base, type, mod_flags, access_chain_is_arrayed, index);
	};

	for (uint32_t i = 0; i < count; i++)
	{
		uint32_t index = indices[i];

		bool is_literal = index_is_literal;
		if (is_literal && msb_is_id && (index >> 31u) != 0u)
		{
			is_literal = false;
			index &= 0x7fffffffu;
		}

		// Pointer chains
		if (ptr_chain && i == 0)
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays)
			{
				dimension_flatten = type->array.size() >= 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(type->array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(*type, j - 1));
				}

				if (type->array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			else
			{
				append_index(index, is_literal);
			}

			if (type->basetype == SPIRType::ControlPointArray)
			{
				type_id = type->parent_type;
				type = &get<SPIRType>(type_id);
			}

			access_chain_is_arrayed = true;
		}
		// Arrays
		else if (!type->array.empty())
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays && !pending_array_enclose)
			{
				dimension_flatten = type->array.size() > 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			assert(type->parent_type);

			auto *var = maybe_get<SPIRVariable>(base);
			if (backend.force_gl_in_out_block && i == 0 && var && is_builtin_variable(*var) &&
			    !has_decoration(type->self, DecorationBlock))
			{
				// This deals with scenarios for tesc/geom where arrays of gl_Position[] are declared.
				// Normally, these variables live in blocks when compiled from GLSL,
				// but HLSL seems to just emit straight arrays here.
				// We must pretend this access goes through gl_in/gl_out arrays
				// to be able to access certain builtins as arrays.
				auto builtin = ir.meta[base].decoration.builtin_type;
				switch (builtin)
				{
				// case BuiltInCullDistance: // These are already arrays, need to figure out rules for these in tess/geom.
				// case BuiltInClipDistance:
				case BuiltInPosition:
				case BuiltInPointSize:
					if (var->storage == StorageClassInput)
						expr = join("gl_in[", to_expression(index, register_expression_read), "].", expr);
					else if (var->storage == StorageClassOutput)
						expr = join("gl_out[", to_expression(index, register_expression_read), "].", expr);
					else
						append_index(index, is_literal);
					break;

				default:
					append_index(index, is_literal);
					break;
				}
			}
			else if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				auto &parent_type = get<SPIRType>(type->parent_type);

				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(parent_type.array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(parent_type, j - 1));
				}

				if (parent_type.array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			// Some builtins are arrays in SPIR-V but not in other languages, e.g. gl_SampleMask[] is an array in SPIR-V but not in Metal.
			// By throwing away the index, we imply the index was 0, which it must be for gl_SampleMask.
			else if (!builtin_translates_to_nonarray(BuiltIn(get_decoration(base, DecorationBuiltIn))))
			{
				append_index(index, is_literal);
			}

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);

			access_chain_is_arrayed = true;
		}
		// For structs, the index refers to a constant, which indexes into the members.
		// We also check if this member is a builtin, since we then replace the entire expression with the builtin one.
		else if (type->basetype == SPIRType::Struct)
		{
			if (!is_literal)
				index = evaluate_constant_u32(index);

			if (index >= type->member_types.size())
				SPIRV_CROSS_THROW("Member index is out of bounds!");

			BuiltIn builtin;
			if (is_member_builtin(*type, index, &builtin))
			{
				if (access_chain_is_arrayed)
				{
					expr += ".";
					expr += builtin_to_glsl(builtin, type->storage);
				}
				else
					expr = builtin_to_glsl(builtin, type->storage);
			}
			else
			{
				// If the member has a qualified name, use it as the entire chain
				string qual_mbr_name = get_member_qualified_name(type_id, index);
				if (!qual_mbr_name.empty())
					expr = qual_mbr_name;
				else if (flatten_member_reference)
					expr += join("_", to_member_name(*type, index));
				else
					expr += to_member_reference(base, *type, index, ptr_chain);
			}

			if (has_member_decoration(type->self, index, DecorationInvariant))
				is_invariant = true;

			is_packed = member_is_packed_physical_type(*type, index);
			if (member_is_remapped_physical_type(*type, index))
				physical_type = get_extended_member_decoration(type->self, index, SPIRVCrossDecorationPhysicalTypeID);
			else
				physical_type = 0;

			row_major_matrix_needs_conversion = member_is_non_native_row_major_matrix(*type, index);
			type = &get<SPIRType>(type->member_types[index]);
		}
		// Matrix -> Vector
		else if (type->columns > 1)
		{
			// If we have a row-major matrix here, we need to defer any transpose in case this access chain
			// is used to store a column. We can resolve it right here and now if we access a scalar directly,
			// by flipping indexing order of the matrix.

			expr += "[";
			if (is_literal)
				expr += convert_to_string(index);
			else
				expr += to_expression(index, register_expression_read);
			expr += "]";

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		// Vector -> Scalar
		else if (type->vecsize > 1)
		{
			string deferred_index;
			if (row_major_matrix_needs_conversion)
			{
				// Flip indexing order.
				auto column_index = expr.find_last_of('[');
				if (column_index != string::npos)
				{
					deferred_index = expr.substr(column_index);
					expr.resize(column_index);
				}
			}

			// Internally, access chain implementation can also be used on composites,
			// ignore scalar access workarounds in this case.
			StorageClass effective_storage;
			if (expression_type(base).pointer)
				effective_storage = get_expression_effective_storage_class(base);
			else
				effective_storage = StorageClassGeneric;

			if (!row_major_matrix_needs_conversion)
			{
				// On some backends, we might not be able to safely access individual scalars in a vector.
				// To work around this, we might have to cast the access chain reference to something which can,
				// like a pointer to scalar, which we can then index into.
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			if (is_literal && !is_packed && !row_major_matrix_needs_conversion)
			{
				expr += ".";
				expr += index_to_swizzle(index);
			}
			else if (ir.ids[index].get_type() == TypeConstant && !is_packed && !row_major_matrix_needs_conversion)
			{
				auto &c = get<SPIRConstant>(index);
				if (c.specialization)
				{
					// If the index is a spec constant, we cannot turn extract into a swizzle.
					expr += join("[", to_expression(index), "]");
				}
				else
				{
					expr += ".";
					expr += index_to_swizzle(c.scalar());
				}
			}
			else if (is_literal)
			{
				// For packed vectors, we can only access them as an array, not by swizzle.
				expr += join("[", index, "]");
			}
			else
			{
				expr += "[";
				expr += to_expression(index, register_expression_read);
				expr += "]";
			}

			if (row_major_matrix_needs_conversion)
			{
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			expr += deferred_index;
			row_major_matrix_needs_conversion = false;

			is_packed = false;
			physical_type = 0;
			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		else if (!backend.allow_truncated_access_chain)
			SPIRV_CROSS_THROW("Cannot subdivide a scalar value!");
	}

	if (pending_array_enclose)
	{
		SPIRV_CROSS_THROW("Flattening of multidimensional arrays were enabled, "
		                  "but the access chain was terminated in the middle of a multidimensional array. "
		                  "This is not supported.");
	}

	if (meta)
	{
		meta->need_transpose = row_major_matrix_needs_conversion;
		meta->storage_is_packed = is_packed;
		meta->storage_is_invariant = is_invariant;
		meta->storage_physical_type = physical_type;
	}

	return expr;
}